

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  LRUHandle *pLVar4;
  undefined8 uVar5;
  long lVar6;
  Mutex *__mutex;
  LRUCache *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0;
  do {
    __mutex = &this->shard_[lVar6].mutex_;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar5 = std::__throw_system_error(iVar3);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          _Unwind_Resume(uVar5);
        }
      }
      goto LAB_00652868;
    }
    this_00 = this->shard_ + lVar6;
    while (pLVar4 = (this_00->lru_).next, pLVar4 != &this_00->lru_) {
      if (pLVar4->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x147,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      if (pLVar4->next == pLVar4) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      pLVar4 = HandleTable::Remove(&this_00->table_,(Slice *)pLVar4->key_data,
                                   (uint32_t)pLVar4->key_length);
      bVar2 = LRUCache::FinishErase(this_00,pLVar4);
      if (!bVar2) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x14a,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00652868:
  __stack_chk_fail();
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }